

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O0

int tcg_target_const_match(tcg_target_long val,TCGType_conflict type,TCGArgConstraint *arg_ct)

{
  ushort uVar1;
  int iVar2;
  int ct;
  TCGArgConstraint *arg_ct_local;
  TCGType_conflict type_local;
  tcg_target_long val_local;
  
  uVar1 = arg_ct->ct;
  if ((uVar1 & 2) == 0) {
    if (((uVar1 & 0x100) == 0) || (val != (int)(uint)val)) {
      if (((uVar1 & 0x200) == 0) || (val != (val & 0xffffffffU))) {
        if (((uVar1 & 0x400) == 0) ||
           ((val ^ 0xffffffffffffffffU) != (long)(int)((uint)val ^ 0xffffffff))) {
          if ((uVar1 & 0x800) != 0) {
            iVar2 = 0x40;
            if (type == TCG_TYPE_I32) {
              iVar2 = 0x20;
            }
            if (val == iVar2) {
              return 1;
            }
          }
          val_local._4_4_ = 0;
        }
        else {
          val_local._4_4_ = 1;
        }
      }
      else {
        val_local._4_4_ = 1;
      }
    }
    else {
      val_local._4_4_ = 1;
    }
  }
  else {
    val_local._4_4_ = 1;
  }
  return val_local._4_4_;
}

Assistant:

static inline int tcg_target_const_match(tcg_target_long val, TCGType type,
                                         const TCGArgConstraint *arg_ct)
{
    int ct = arg_ct->ct;
    if (ct & TCG_CT_CONST) {
        return 1;
    }
    if ((ct & TCG_CT_CONST_S32) && val == (int32_t)val) {
        return 1;
    }
    if ((ct & TCG_CT_CONST_U32) && val == (uint32_t)val) {
        return 1;
    }
    if ((ct & TCG_CT_CONST_I32) && ~val == (int32_t)~val) {
        return 1;
    }
    if ((ct & TCG_CT_CONST_WSZ) && val == (type == TCG_TYPE_I32 ? 32 : 64)) {
        return 1;
    }
    return 0;
}